

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall SQVM::Return<false>(SQVM *this,SQInteger _arg0,SQInteger _arg1,SQObjectPtr *retval)

{
  long lVar1;
  SQObjectPtr *this_00;
  SQVM *in_RCX;
  long in_RSI;
  long in_RDI;
  SQObjectPtr *dest;
  SQInteger callerbase;
  SQBool _isroot;
  SQVM *obj;
  
  lVar1 = *(long *)(*(long *)(in_RDI + 0x118) + 0x40);
  this_00 = (SQObjectPtr *)
            (*(long *)(in_RDI + 0x50) - (long)*(int *)(*(long *)(in_RDI + 0x118) + 0x2c));
  obj = in_RCX;
  if (lVar1 == 0) {
    if (*(int *)(*(long *)(in_RDI + 0x118) + 0x34) == -1) {
      obj = (SQVM *)0x0;
    }
    else {
      obj = (SQVM *)(*(long *)(in_RDI + 0x30) +
                    ((long)&(this_00->super_SQObject)._type +
                    (long)*(int *)(*(long *)(in_RDI + 0x118) + 0x34)) * 0x10);
    }
  }
  if (obj != (SQVM *)0x0) {
    if (in_RSI == 0xff) {
      ::SQObjectPtr::Null(this_00);
    }
    else {
      ::SQObjectPtr::operator=(this_00,(SQObjectPtr *)obj);
    }
  }
  LeaveFrame(in_RCX);
  return (bool)(-(lVar1 != 0) & 1);
}

Assistant:

bool SQVM::Return(SQInteger _arg0, SQInteger _arg1, SQObjectPtr &retval)
{
    SQBool    _isroot      = ci->_root;
    SQInteger callerbase   = _stackbase - ci->_prevstkbase;
    if constexpr (debughookPresent)
    {
        if (_debughook) {
            for(SQInteger i=0; i<ci->_ncalls; i++) {
                CallDebugHook(_SC('r'));
            }
        }
    }

    SQObjectPtr *dest;
    if (_isroot) {
        dest = &(retval);
    } else if (ci->_target == -1) {
        dest = NULL;
    } else {
        dest = &_stack._vals[callerbase + ci->_target];
    }
    if (dest) {
        if(_arg0 != 0xFF) {
            *dest = _stack._vals[_stackbase+_arg1];
        }
        else {
            dest->Null();
        }
        //*dest = (_arg0 != 0xFF) ? _stack._vals[_stackbase+_arg1] : _null_;
    }
    LeaveFrame();
    return _isroot ? true : false;
}